

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O2

int PHYSFS_setWriteDir(char *newDir)

{
  int iVar1;
  uint uVar2;
  
  __PHYSFS_platformGrabMutex(stateLock);
  if (writeDir != (DirHandle *)0x0) {
    iVar1 = freeDirHandle(writeDir,openWriteList);
    if (iVar1 == 0) {
      uVar2 = 0;
      goto LAB_0010763a;
    }
    writeDir = (DirHandle *)0x0;
  }
  if (newDir == (char *)0x0) {
    uVar2 = 1;
  }
  else {
    writeDir = createDirHandle((PHYSFS_Io *)0x0,newDir,(char *)0x0,1);
    uVar2 = (uint)(writeDir != (DirHandle *)0x0);
  }
LAB_0010763a:
  __PHYSFS_platformReleaseMutex(stateLock);
  return uVar2;
}

Assistant:

int PHYSFS_setWriteDir(const char *newDir)
{
    int retval = 1;

    __PHYSFS_platformGrabMutex(stateLock);

    if (writeDir != NULL)
    {
        BAIL_IF_MUTEX_ERRPASS(!freeDirHandle(writeDir, openWriteList),
                            stateLock, 0);
        writeDir = NULL;
    } /* if */

    if (newDir != NULL)
    {
        writeDir = createDirHandle(NULL, newDir, NULL, 1);
        retval = (writeDir != NULL);
    } /* if */

    __PHYSFS_platformReleaseMutex(stateLock);

    return retval;
}